

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

char * diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::
       get_extra_required_extension_predicate(Candidate c)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = "";
  if (c == AMD_gcn_shader) {
    pcVar2 = "(defined(GL_AMD_gpu_shader_int64) || defined(GL_NV_gpu_shader5))";
  }
  pcVar1 = "defined(GL_ARB_shader_int64)";
  if (c != ARB_shader_ballot) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const char *CompilerGLSL::ShaderSubgroupSupportHelper::get_extra_required_extension_predicate(Candidate c)
{
	switch (c)
	{
	case ARB_shader_ballot:
		return "defined(GL_ARB_shader_int64)";
	case AMD_gcn_shader:
		return "(defined(GL_AMD_gpu_shader_int64) || defined(GL_NV_gpu_shader5))";
	default:
		return "";
	}
}